

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCADeserialization.cpp
# Opt level: O1

bool __thiscall
Js::DeserializationCloner<Js::StreamReader>::TryClonePrimitive
          (DeserializationCloner<Js::StreamReader> *this,SrcTypeId typeId,Src src,Dst *dst)

{
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar1;
  bool bVar2;
  Engine *pEVar3;
  JavascriptBoolean *pJVar4;
  uint local_2c;
  uint uStack_28;
  scaposition_t pos;
  int32 n;
  
  bVar2 = false;
  if (10 < (int)typeId) {
    return false;
  }
  if (SCA_LastPrimitive < typeId) {
    return false;
  }
  scriptContext =
       (this->
       super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
       ).super_ScriptContextHolder.m_scriptContext;
  pJVar1 = (scriptContext->super_ScriptContextBase).javascriptLibrary;
  switch(typeId) {
  case SCA_None:
    *dst = (Dst)0x0;
    goto LAB_00f1d109;
  case SCA_Reference:
    StreamReader::Read<unsigned_int>(this->m_reader,&local_2c);
    pEVar3 = ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
             ::GetEngine(&this->
                          super_ClonerBase<unsigned_int,_void_*,_SCATypeId,_Js::DeserializationCloner<Js::StreamReader>_>
                        );
    uStack_28 = local_2c;
    bVar2 = JsUtil::
            BaseDictionary<unsigned_int,_void_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::TryGetValue<unsigned_int>(pEVar3->m_clonedObjects,&stack0xffffffffffffffd8,dst);
    if (!bVar2) {
      ScriptContextHolder::ThrowSCADataCorrupt((ScriptContextHolder *)this);
    }
    goto LAB_00f1d109;
  case SCA_NullValue:
    pJVar4 = (JavascriptBoolean *)(pJVar1->super_JavascriptLibraryBase).nullValue.ptr;
    break;
  case SCA_UndefinedValue:
    pJVar4 = (JavascriptBoolean *)(pJVar1->super_JavascriptLibraryBase).undefinedValue.ptr;
    break;
  case SCA_TrueValue:
    pJVar4 = (pJVar1->super_JavascriptLibraryBase).booleanTrue.ptr;
    break;
  case SCA_FalseValue:
    pJVar4 = (pJVar1->super_JavascriptLibraryBase).booleanFalse.ptr;
    break;
  case SCA_Int32Value:
    StreamReader::Read<int>(this->m_reader,(int *)&stack0xffffffffffffffd8);
    pJVar4 = (JavascriptBoolean *)((ulong)uStack_28 | 0x1000000000000);
    break;
  case SCA_DoubleValue:
    StreamReader::Read<double>(this->m_reader,(double *)&stack0xffffffffffffffd8);
    pJVar4 = (JavascriptBoolean *)
             JavascriptNumber::ToVarWithCheck((double)CONCAT44(pos,uStack_28),scriptContext);
    break;
  case SCA_StringValue:
    goto switchD_00f1d020_caseD_8;
  case SCA_Int64Value:
    StreamReader::Read<long>(this->m_reader,(long *)&stack0xffffffffffffffd8);
    pJVar4 = (JavascriptBoolean *)
             JavascriptTypedNumber<long>::ToVar(CONCAT44(pos,uStack_28),scriptContext);
    break;
  case SCA_LastPrimitive:
    StreamReader::Read<unsigned_long>(this->m_reader,(unsigned_long *)&stack0xffffffffffffffd8);
    pJVar4 = (JavascriptBoolean *)
             JavascriptTypedNumber<unsigned_long>::ToVar(CONCAT44(pos,uStack_28),scriptContext);
  }
  *dst = pJVar4;
LAB_00f1d109:
  bVar2 = true;
switchD_00f1d020_caseD_8:
  return bVar2;
}

Assistant:

bool DeserializationCloner<Reader>::TryClonePrimitive(SrcTypeId typeId, Src src, Dst* dst)
    {
        if (!IsSCAPrimitive(typeId))
        {
            return false;
        }

        ScriptContext* scriptContext = this->GetScriptContext();
        JavascriptLibrary* lib = scriptContext->GetLibrary();

        switch (typeId)
        {
        case SCA_None:
            *dst = NULL;
            break;

        case SCA_Reference: // Handle reference explictly as a primitive
            {
                scaposition_t pos;
                m_reader->Read(&pos);
                if (!this->GetEngine()->TryGetClonedObject(pos, dst))
                {
                    this->ThrowSCADataCorrupt();
                }
            }
            break;

        case SCA_NullValue:
            *dst = lib->GetNull();
            break;

        case SCA_UndefinedValue:
            *dst = lib->GetUndefined();
            break;

        case SCA_TrueValue:
            *dst = lib->GetTrue();
            break;

        case SCA_FalseValue:
            *dst = lib->GetFalse();
            break;

        case SCA_Int32Value:
            {
                int32 n;
                m_reader->Read(&n);
                *dst = JavascriptNumber::ToVar(n, scriptContext);
            }
            break;

        case SCA_DoubleValue:
            {
                double dbl;
                m_reader->Read(&dbl);
                *dst = JavascriptNumber::ToVarWithCheck(dbl, scriptContext);
            }
            break;

        case SCA_Int64Value:
            {
                __int64 n;
                m_reader->Read(&n);
                *dst = JavascriptInt64Number::ToVar(n, scriptContext);
            }
            break;

        case SCA_Uint64Value:
            {
                unsigned __int64 n;
                m_reader->Read(&n);
                *dst = JavascriptUInt64Number::ToVar(n, scriptContext);
            }
            break;

        default:
            return false; // Not a recognized primitive type
        }

        return true;
    }